

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CCtx_params * ZSTD_createCCtxParams_advanced(ZSTD_customMem customMem)

{
  ZSTD_customMem customMem_00;
  void *unaff_retaddr;
  ZSTD_allocFunction in_stack_00000008;
  ZSTD_freeFunction in_stack_00000010;
  void *in_stack_00000018;
  ZSTD_CCtx_params *params;
  undefined8 in_stack_fffffffffffffff0;
  undefined8 in_stack_fffffffffffffff8;
  ZSTD_CCtx_params *pZVar1;
  
  if ((in_stack_00000008 == (ZSTD_allocFunction)0x0) ==
      (in_stack_00000010 == (ZSTD_freeFunction)0x0)) {
    customMem_00.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffff8;
    customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffff0;
    customMem_00.opaque = unaff_retaddr;
    pZVar1 = (ZSTD_CCtx_params *)ZSTD_calloc((size_t)in_stack_00000018,customMem_00);
    if (pZVar1 == (ZSTD_CCtx_params *)0x0) {
      pZVar1 = (ZSTD_CCtx_params *)0x0;
    }
    else {
      (pZVar1->customMem).customAlloc = in_stack_00000008;
      (pZVar1->customMem).customFree = in_stack_00000010;
      (pZVar1->customMem).opaque = in_stack_00000018;
      pZVar1->compressionLevel = 3;
      (pZVar1->fParams).contentSizeFlag = 1;
    }
  }
  else {
    pZVar1 = (ZSTD_CCtx_params *)0x0;
  }
  return pZVar1;
}

Assistant:

static ZSTD_CCtx_params* ZSTD_createCCtxParams_advanced(
        ZSTD_customMem customMem)
{
    ZSTD_CCtx_params* params;
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;
    params = (ZSTD_CCtx_params*)ZSTD_calloc(
            sizeof(ZSTD_CCtx_params), customMem);
    if (!params) { return NULL; }
    params->customMem = customMem;
    params->compressionLevel = ZSTD_CLEVEL_DEFAULT;
    params->fParams.contentSizeFlag = 1;
    return params;
}